

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseDocTypeDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlChar *URI;
  xmlChar *ExternalID;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  ExternalID = (xmlChar *)0x0;
  URI = (xmlChar *)0x0;
  iVar2 = 8;
  if (ctxt->mlType == XML_TYPE_XML) {
    iVar2 = 9;
  }
  ctxt->input->cur = ctxt->input->cur + iVar2;
  iVar2 = 8;
  if (ctxt->mlType == XML_TYPE_XML) {
    iVar2 = 9;
  }
  ctxt->input->col = iVar2 + ctxt->input->col;
  name = (xmlChar *)ctxt;
  if (*ctxt->input->cur == '\0') {
    xmlParserInputGrow(ctxt->input,0xfa);
  }
  xmlSkipBlankChars((xmlParserCtxtPtr)name);
  ExternalID = xmlParseName((xmlParserCtxtPtr)name);
  if (ExternalID == (xmlChar *)0x0) {
    xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_NAME_REQUIRED,
                   "xmlParseDocTypeDecl : no DOCTYPE name !\n");
  }
  *(xmlChar **)(name + 0x158) = ExternalID;
  xmlSkipBlankChars((xmlParserCtxtPtr)name);
  pxVar1 = xmlParseExternalID((xmlParserCtxtPtr)name,&URI,1);
  if ((pxVar1 != (xmlChar *)0x0) || (URI != (xmlChar *)0x0)) {
    name[0x8c] = '\x01';
    name[0x8d] = '\0';
    name[0x8e] = '\0';
    name[0x8f] = '\0';
  }
  *(xmlChar **)(name + 0x160) = pxVar1;
  *(xmlChar **)(name + 0x168) = URI;
  xmlSkipBlankChars((xmlParserCtxtPtr)name);
  if (((*(long *)name != 0) && (**(long **)name != 0)) && (*(int *)(name + 0x14c) == 0)) {
    (*(code *)**(undefined8 **)name)(*(undefined8 *)(name + 8),ExternalID,URI,pxVar1);
  }
  if ((*(int *)(name + 0x110) != -1) && (**(char **)(*(long *)(name + 0x38) + 0x20) != '[')) {
    if (((*(int *)(name + 0x2f0) != 1) || (**(char **)(*(long *)(name + 0x38) + 0x20) != '>')) &&
       ((*(int *)(name + 0x2f0) != 2 ||
        ((**(char **)(*(long *)(name + 0x38) + 0x20) != '\n' &&
         (**(char **)(*(long *)(name + 0x38) + 0x20) != ';')))))) {
      xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_DOCTYPE_NOT_FINISHED,(char *)0x0);
    }
    xmlNextChar((xmlParserCtxtPtr)name);
  }
  return;
}

Assistant:

void
xmlParseDocTypeDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name = NULL;
    xmlChar *ExternalID = NULL;
    xmlChar *URI = NULL;

    DEBUG_ENTER(("xmlParseDocTypeDecl(%s);\n", dbgCtxt(ctxt)));

    /*
     * We know that '<!DOCTYPE' has been detected.
     */
    SKIP_MLI(9);

    SKIP_BLANKS;

    /*
     * Parse the DOCTYPE name.
     */
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseDocTypeDecl : no DOCTYPE name !\n");
    }
    ctxt->intSubName = name;

    SKIP_BLANKS;

    /*
     * Check for SystemID and ExternalID
     */
    URI = xmlParseExternalID(ctxt, &ExternalID, 1);

    if ((URI != NULL) || (ExternalID != NULL)) {
        ctxt->hasExternalSubset = 1;
    }
    ctxt->extSubURI = URI;
    ctxt->extSubSystem = ExternalID;

    SKIP_BLANKS;

    /*
     * Create and update the internal subset.
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->internalSubset != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->internalSubset(ctxt->userData, name, ExternalID, URI);
    if (ctxt->instate == XML_PARSER_EOF)
	RETURN();

    /*
     * Is there any internal subset declarations ?
     * they are handled separately in xmlParseInternalSubset()
     */
    if (RAW == '[')
	RETURN();

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if (!RAW_IS_GT_MLI) { /* (RAW != '>') */
	xmlFatalErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED, NULL);
    }
    NEXT;
    RETURN();
}